

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeRotationAxis
          (DeadReckoningCalculator *this,TMATRIX *curOrientationMatrix)

{
  Vector *this_00;
  bool bVar1;
  bool bVar2;
  float fVar3;
  float Y;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (this->m_bQuaxAxisSet == false) {
    fVar4 = curOrientationMatrix->Data[1][2] - curOrientationMatrix->Data[2][1];
    fVar6 = curOrientationMatrix->Data[2][0] - curOrientationMatrix->Data[0][2];
    fVar5 = curOrientationMatrix->Data[0][1] - curOrientationMatrix->Data[1][0];
    fVar3 = fVar5 * fVar5 + fVar4 * fVar4 + fVar6 * fVar6;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    bVar1 = NAN(fVar3);
    bVar2 = fVar3 == 0.0;
    Y = fVar6 / fVar3;
    if ((bVar2) && (!bVar1)) {
      Y = fVar6;
    }
    fVar6 = fVar5 / fVar3;
    if ((bVar2) && (!bVar1)) {
      fVar6 = fVar5;
    }
    fVar3 = fVar4 / fVar3;
    if ((bVar2) && (!bVar1)) {
      fVar3 = fVar4;
    }
    this_00 = &this->m_quatAxis;
    DATA_TYPE::Vector::SetX(this_00,(KFLOAT32)fVar3);
    DATA_TYPE::Vector::SetY(this_00,(KFLOAT32)Y);
    DATA_TYPE::Vector::SetZ(this_00,(KFLOAT32)fVar6);
    this->m_bQuaxAxisSet = true;
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeRotationAxis( const TMATRIX& curOrientationMatrix )
{
    if (!m_bQuaxAxisSet)
    {
        KFLOAT32 x,y,z;
        x = curOrientationMatrix.Data[1][2] - curOrientationMatrix.Data[2][1];
        y = curOrientationMatrix.Data[2][0] - curOrientationMatrix.Data[0][2];
        z = curOrientationMatrix.Data[0][1] - curOrientationMatrix.Data[1][0];

        // normalise
        KFLOAT32 len = sqrt(x * x + y * y + z * z);

        if (len != 0)
        {
            x /= len;
            y /= len;
            z /= len;
        }

        m_quatAxis.SetX(x);
        m_quatAxis.SetY(y);
        m_quatAxis.SetZ(z);

        m_bQuaxAxisSet = true;
    }
}